

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

BOOL __thiscall
Js::DebugDocument::GetStatementSpan(DebugDocument *this,int32 ibos,StatementSpan *pStatement)

{
  BOOL BVar1;
  undefined1 local_40 [8];
  StatementLocation statement;
  StatementSpan *pStatement_local;
  int32 ibos_local;
  DebugDocument *this_local;
  
  statement.bytecodeSpan = (Interval)pStatement;
  StatementLocation::StatementLocation((StatementLocation *)local_40);
  BVar1 = GetStatementLocation(this,ibos,(StatementLocation *)local_40);
  if (BVar1 != 0) {
    *(int *)statement.bytecodeSpan = (int)statement.function;
    *(int *)((long)statement.bytecodeSpan + 4) = statement.function._4_4_ - (int)statement.function;
  }
  this_local._4_4_ = (uint)(BVar1 != 0);
  return this_local._4_4_;
}

Assistant:

BOOL DebugDocument::GetStatementSpan(int32 ibos, StatementSpan* pStatement)
    {
        StatementLocation statement;
        if (GetStatementLocation(ibos, &statement))
        {
            pStatement->ich = statement.statement.begin;
            pStatement->cch = statement.statement.end - statement.statement.begin;
            return TRUE;
        }
        return FALSE;
    }